

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double bradford_cdf_inv(double cdf,double a,double b,double c)

{
  double dVar1;
  double local_30;
  double x;
  double c_local;
  double b_local;
  double a_local;
  double cdf_local;
  
  local_30 = 0.0;
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar1 = a;
    if (0.0 < cdf) {
      if (1.0 <= cdf) {
        dVar1 = local_30;
        if (1.0 <= cdf) {
          dVar1 = b;
        }
      }
      else {
        dVar1 = pow(c + 1.0,cdf);
        dVar1 = a + ((b - a) * (dVar1 - 1.0)) / c;
      }
    }
    local_30 = dVar1;
    return local_30;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"BRADFORD_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double bradford_cdf_inv ( double cdf, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    BRADFORD_CDF_INV inverts the Bradford CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, B, C, the parameters of the PDF.
//    A < B,
//    0.0 < C.
//
//    Output, double BRADFORD_CDF_INV, the corresponding argument of the CDF.
//
{
  double x = 0.0;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "BRADFORD_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf <= 0.0 )
  {
    x = a;
  }
  else if ( cdf < 1.0 )
  {
    x = a + ( b - a ) * ( pow ( ( c + 1.0 ), cdf ) - 1.0 ) / c;
  }
  else if ( 1.0 <= cdf )
  {
    x = b;
  }

  return x;
}